

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu_Impl.cpp
# Opt level: O3

void __thiscall Vgm_Emu_Impl::write_pcm(Vgm_Emu_Impl *this,vgm_time_t vgm_time,int amp)

{
  int iVar1;
  
  iVar1 = this->dac_amp;
  this->dac_amp = amp;
  if (-1 < iVar1) {
    Blip_Synth<8,_1>::offset_inline
              (&this->dac_synth,this->blip_time_factor * vgm_time >> 0xc,amp - iVar1,&this->blip_buf
              );
    return;
  }
  this->dac_amp = amp | this->dac_disabled;
  return;
}

Assistant:

void Vgm_Emu_Impl::write_pcm( vgm_time_t vgm_time, int amp )
{
	blip_time_t blip_time = to_blip_time( vgm_time );
	int old = dac_amp;
	int delta = amp - old;
	dac_amp = amp;
	if ( old >= 0 )
		dac_synth.offset_inline( blip_time, delta, &blip_buf );
	else
		dac_amp |= dac_disabled;
}